

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939acd.c
# Opt level: O0

int must_warn(int ret)

{
  int *piVar1;
  int in_EDI;
  int local_4;
  
  if (in_EDI < 0) {
    piVar1 = __errno_location();
    if ((*piVar1 == 4) || (*piVar1 == 0x69)) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int must_warn(int ret)
{
	if (ret >= 0)
		return 0;
	switch (errno) {
	case EINTR:
	case ENOBUFS:
		return 0;
	}
	return 1;
}